

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O0

void __thiscall
cmRulePlaceholderExpander::ExpandRuleVariables
          (cmRulePlaceholderExpander *this,cmOutputConverter *outputConverter,string *s,
          RuleVariables *replaceValues)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  bool bVar5;
  string local_f8 [32];
  string local_d8 [32];
  undefined1 local_b8 [8];
  string replace;
  string var;
  char c;
  size_type end;
  string expandedInput;
  size_type pos;
  size_type start;
  RuleVariables *replaceValues_local;
  string *s_local;
  cmOutputConverter *outputConverter_local;
  cmRulePlaceholderExpander *this_local;
  
  cVar4 = (char)s;
  pos = std::__cxx11::string::find(cVar4,0x3c);
  if (pos != 0xffffffffffffffff) {
    expandedInput.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)&end);
    while( true ) {
      bVar5 = false;
      if (pos != 0xffffffffffffffff) {
        lVar2 = std::__cxx11::string::size();
        bVar5 = pos < lVar2 - 2U;
      }
      if (!bVar5) break;
      lVar2 = std::__cxx11::string::find(cVar4,0x3e);
      if (lVar2 == -1) goto LAB_0046393e;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      iVar1 = isalpha((int)*pcVar3);
      if (iVar1 == 0) {
        pos = std::__cxx11::string::find(cVar4,0x3c);
      }
      else {
        std::__cxx11::string::substr((ulong)((long)&replace.field_2 + 8),(ulong)s);
        ExpandRuleVariable((string *)local_b8,this,outputConverter,
                           (string *)((long)&replace.field_2 + 8),replaceValues);
        std::__cxx11::string::substr((ulong)local_d8,(ulong)s);
        std::__cxx11::string::operator+=((string *)&end,local_d8);
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::operator+=((string *)&end,(string *)local_b8);
        std::__cxx11::string::size();
        pos = std::__cxx11::string::find(cVar4,0x3c);
        expandedInput.field_2._8_8_ = lVar2 + 1;
        std::__cxx11::string::~string((string *)local_b8);
        std::__cxx11::string::~string((string *)(replace.field_2._M_local_buf + 8));
      }
    }
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_f8,(ulong)s);
    std::__cxx11::string::operator+=((string *)&end,local_f8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::operator=((string *)s,(string *)&end);
LAB_0046393e:
    std::__cxx11::string::~string((string *)&end);
  }
  return;
}

Assistant:

void cmRulePlaceholderExpander::ExpandRuleVariables(
  cmOutputConverter* outputConverter, std::string& s,
  const RuleVariables& replaceValues)
{
  std::string::size_type start = s.find('<');
  // no variables to expand
  if (start == std::string::npos) {
    return;
  }
  std::string::size_type pos = 0;
  std::string expandedInput;
  while (start != std::string::npos && start < s.size() - 2) {
    std::string::size_type end = s.find('>', start);
    // if we find a < with no > we are done
    if (end == std::string::npos) {
      return;
    }
    char c = s[start + 1];
    // if the next char after the < is not A-Za-z then
    // skip it and try to find the next < in the string
    if (!isalpha(c)) {
      start = s.find('<', start + 1);
    } else {
      // extract the var
      std::string var = s.substr(start + 1, end - start - 1);
      std::string replace =
        this->ExpandRuleVariable(outputConverter, var, replaceValues);
      expandedInput += s.substr(pos, start - pos);
      expandedInput += replace;
      // move to next one
      start = s.find('<', start + var.size() + 2);
      pos = end + 1;
    }
  }
  // add the rest of the input
  expandedInput += s.substr(pos, s.size() - pos);
  s = expandedInput;
}